

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmake.cpp
# Opt level: O0

void __thiscall
CTcMake::build_symbol_file
          (CTcMake *this,CTcHostIfc *hostifc,CResLoader *res_loader,textchar_t *src_fname,
          textchar_t *sym_fname,CTcMakeModule *src_mod,int *error_count,int *warning_count)

{
  CTcMain *this_00;
  uint uVar1;
  int iVar2;
  undefined8 *puVar3;
  long *plVar4;
  size_t sVar5;
  FILE *fp_00;
  char *in_RCX;
  EVP_PKEY_CTX *in_RSI;
  CTcParser *in_RDI;
  char *in_R8;
  CTcMakeModule *in_R9;
  int *in_stack_00000008;
  int *in_stack_00000010;
  int err;
  err_frame_t err_cur__;
  CVmFile *fp;
  osfildef *fpout;
  CVmFile *in_stack_fffffffffffffe70;
  CTcMake *pCVar6;
  CTcTokenizer *in_stack_fffffffffffffe78;
  undefined8 uVar7;
  CTcParser *in_stack_fffffffffffffe80;
  char *orig_name;
  CTcTokenizer *in_stack_fffffffffffffec8;
  uint local_120 [2];
  undefined8 local_118;
  CTcMake *in_stack_fffffffffffffef0;
  CVmFile *in_stack_fffffffffffffef8;
  CTcParser *in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff1c;
  CTcParser *in_stack_ffffffffffffff20;
  CTcMake *in_stack_ffffffffffffffa0;
  CVmFile *local_40;
  
  local_40 = (CVmFile *)0x0;
  puVar3 = (undefined8 *)_ZTW11G_err_frame();
  local_118 = *puVar3;
  plVar4 = (long *)_ZTW11G_err_frame();
  *plVar4 = (long)local_120;
  local_120[0] = _setjmp((__jmp_buf_tag *)&stack0xfffffffffffffef8);
  if (local_120[0] == 0) {
    CTcMain::init(in_RSI);
    set_compiler_options(in_stack_ffffffffffffffa0);
    orig_name = in_RCX;
    CTcMakeModule::get_orig_name((CTcMakeModule *)0x20a708);
    uVar1 = CTcTokenizer::set_source(in_stack_fffffffffffffec8,(char *)in_RDI,orig_name);
    this_00 = G_tcmain;
    if (uVar1 == 0) {
      CTcParser::set_syntax_only(G_prs,1);
      CTcTokenizer::next(in_stack_fffffffffffffe78);
      CTcMakeModule::get_orig_name((CTcMakeModule *)0x20a7b9);
      CTcMakeModule::get_seqno(in_R9);
      CTcParser::set_module_info
                (in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78,
                 (int)((ulong)in_stack_fffffffffffffe70 >> 0x20));
      CTcParser::set_source_text_group_mode(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
      CTcParser::parse_top(in_RDI);
      iVar2 = CTcMain::get_error_count(G_tcmain);
      if (iVar2 == 0) {
        fp_00 = fopen(in_R8,"wb");
        if (fp_00 == (FILE *)0x0) {
          CTcMain::log_error(G_tcmain,(CTcTokFileDesc *)0x0,0,TC_SEV_ERROR,0x2968,in_R8);
        }
        else {
          local_40 = (CVmFile *)operator_new(0x10);
          CVmFile::CVmFile(local_40);
          CVmFile::set_file(local_40,(osfildef *)fp_00,0);
          CTcParser::write_symbol_file
                    (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
        }
      }
    }
    else {
      sVar5 = strlen(in_RCX);
      CTcMain::log_error(this_00,(CTcTokFileDesc *)0x0,0,TC_SEV_ERROR,(int)(ulong)uVar1,
                         sVar5 & 0xffffffff,in_RCX);
    }
  }
  if ((local_120[0] & 0x8000) == 0) {
    local_120[0] = local_120[0] | 0x8000;
    iVar2 = CTcMain::get_error_count(G_tcmain);
    *in_stack_00000008 = iVar2 + *in_stack_00000008;
    iVar2 = CTcMain::get_warning_count(G_tcmain);
    *in_stack_00000010 = iVar2 + *in_stack_00000010;
    if ((local_40 != (CVmFile *)0x0) && (local_40 != (CVmFile *)0x0)) {
      CVmFile::~CVmFile(in_stack_fffffffffffffe70);
      operator_delete(local_40,0x10);
    }
    if ((*in_stack_00000008 != 0) || ((in_RDI->finalize_prop_ != 0 && (*in_stack_00000010 != 0)))) {
      remove(in_R8);
    }
    CTcMain::terminate();
  }
  uVar7 = local_118;
  puVar3 = (undefined8 *)_ZTW11G_err_frame();
  *puVar3 = uVar7;
  if ((local_120[0] & 0x4001) != 0) {
    puVar3 = (undefined8 *)_ZTW11G_err_frame();
    pCVar6 = in_stack_fffffffffffffef0;
    if ((*(uint *)*puVar3 & 2) != 0) {
      plVar4 = (long *)_ZTW11G_err_frame();
      free(*(void **)(*plVar4 + 0x10));
      pCVar6 = in_stack_fffffffffffffef0;
    }
    in_stack_fffffffffffffef0 = pCVar6;
    plVar4 = (long *)_ZTW11G_err_frame();
    *(CTcMake **)(*plVar4 + 0x10) = pCVar6;
    err_rethrow();
  }
  if ((local_120[0] & 2) != 0) {
    free(in_stack_fffffffffffffef0);
  }
  return;
}

Assistant:

void CTcMake::build_symbol_file(CTcHostIfc *hostifc,
                                CResLoader *res_loader,
                                const textchar_t *src_fname,
                                const textchar_t *sym_fname,
                                CTcMakeModule *src_mod,
                                int *error_count, int *warning_count)
{
    osfildef *fpout;
    CVmFile *volatile fp = 0;

    err_try
    {
        int err;
        
        /* initialize the compiler */
        CTcMain::init(hostifc, res_loader, source_charset_);

        /* set options */
        set_compiler_options();
        
        /* set up the tokenizer with the main input file */
        err = G_tok->set_source(src_fname, src_mod->get_orig_name());
        if (err != 0)
        {
            G_tcmain->log_error(0, 0, TC_SEV_ERROR, err,
                                (int)strlen(src_fname), src_fname);
            goto done;
        }
        
        /* parse in syntax-only mode */
        G_prs->set_syntax_only(TRUE);

        /* read the first token */
        G_tok->next();

        /* give the parser the module information */
        G_prs->set_module_info(
            src_mod->get_orig_name(), src_mod->get_seqno());

        /* set the sourceTextGroup mode */
        G_prs->set_source_text_group_mode(src_group_mode_);

        /* parse at the top level */
        G_prs->parse_top();

        /* if no errors occurred, write the symbol file */
        if (G_tcmain->get_error_count() == 0)
        {
            /* set up the output file */
            fpout = osfopwb(sym_fname, OSFTT3SYM);
            if (fpout == 0)
            {
                G_tcmain->log_error(0, 0, TC_SEV_ERROR,
                                    TCERR_MAKE_CANNOT_CREATE_SYM, sym_fname);
                goto done;
            }
            fp = new CVmFile();
            fp->set_file(fpout, 0);

            /* write the symbol file */
            G_prs->write_symbol_file(fp, this);
        }

    done: ;
    }